

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

HANDLE CreateFileW(LPCWSTR lpFileName,DWORD dwDesiredAccess,DWORD dwShareMode,
                  LPSECURITY_ATTRIBUTES lpSecurityAttributes,DWORD dwCreationDisposition,
                  DWORD dwFlagsAndAttributes,HANDLE hTemplateFile)

{
  undefined1 *puVar1;
  undefined8 lpFileName_00;
  PAL_ERROR PVar2;
  DWORD DVar3;
  CPalThread *pThread;
  size_t sVar4;
  PAL_ERROR *pPVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined1 *local_90;
  HANDLE hRet;
  DWORD local_80;
  DWORD local_7c;
  undefined1 local_78 [8];
  PathCharString namePathString;
  
  namePathString.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  namePathString._32_8_ = local_78;
  namePathString.m_size = 0;
  local_90 = &DAT_ffffffffffffffff;
  hRet._4_4_ = dwCreationDisposition;
  local_80 = dwShareMode;
  local_7c = dwFlagsAndAttributes;
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    if (lpFileName == (LPCWSTR)0x0) {
      iVar6 = 0;
    }
    else {
      sVar4 = PAL_wcslen(lpFileName);
      iVar6 = ((int)sVar4 + 1) * MaxWCharToAcpLengthFactor;
    }
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_78,(long)iVar6);
    lpFileName_00 = namePathString._32_8_;
    if (namePathString._32_8_ == 0) {
      PVar2 = 8;
    }
    else {
      iVar6 = WideCharToMultiByte(0,0,lpFileName,-1,(LPSTR)namePathString._32_8_,iVar6,(LPCSTR)0x0,
                                  (LPBOOL)0x0);
      if ((ulong)(long)iVar6 < namePathString.m_size) {
        namePathString.m_size = (long)iVar6;
      }
      *(undefined1 *)(namePathString._32_8_ + namePathString.m_size) = 0;
      if (iVar6 == 0) {
        DVar3 = GetLastError();
        if (DVar3 == 0x7a) {
          PVar2 = 0xce;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00328df2;
        }
        else {
          fprintf(_stderr,"] %s %s:%d","CreateFileW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                  ,0x3fc);
          PVar2 = 0x54f;
          fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
        }
      }
      else {
        PVar2 = CorUnix::InternalCreateFile
                          (pThread,(LPCSTR)lpFileName_00,dwDesiredAccess,local_80,
                           lpSecurityAttributes,hRet._4_4_,local_7c,hTemplateFile,&local_90);
      }
    }
    pPVar5 = (PAL_ERROR *)__errno_location();
    puVar1 = local_90;
    *pPVar5 = PVar2;
    if (PAL_InitializeChakraCoreCalled != false) {
      StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_78);
      if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != namePathString.m_count) {
        __stack_chk_fail();
      }
      return puVar1;
    }
  }
LAB_00328df2:
  abort();
}

Assistant:

HANDLE
PALAPI
CreateFileW(
        IN LPCWSTR lpFileName,
        IN DWORD dwDesiredAccess,
        IN DWORD dwShareMode,
        IN LPSECURITY_ATTRIBUTES lpSecurityAttributes,
        IN DWORD dwCreationDisposition,
        IN DWORD dwFlagsAndAttributes,
        IN HANDLE hTemplateFile)
{
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;
    PathCharString namePathString;
    char * name;
    int size;
    int length = 0;
    HANDLE  hRet = INVALID_HANDLE_VALUE;

    PERF_ENTRY(CreateFileW);
    ENTRY("CreateFileW(lpFileName=%p (%S), dwAccess=%#x, dwShareMode=%#x, "
          "lpSecurityAttr=%p, dwDisposition=%#x, dwFlags=%#x, hTemplateFile=%p )\n",
          lpFileName?lpFileName:W16_NULLSTRING,
          lpFileName?lpFileName:W16_NULLSTRING, dwDesiredAccess, dwShareMode,
          lpSecurityAttributes, dwCreationDisposition, dwFlagsAndAttributes,
          hTemplateFile);

    pThread = InternalGetCurrentThread();

    if (lpFileName != NULL)
    {
        length = (PAL_wcslen(lpFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    name = namePathString.OpenStringBuffer(length);
    if (NULL == name)
    {
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    
    size = WideCharToMultiByte( CP_ACP, 0, lpFileName, -1, name, length,
                                NULL, NULL );
    namePathString.CloseBuffer(size);    

    if( size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            palError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            palError = ERROR_INTERNAL_ERROR;
        }
        goto done;
    }

    palError = InternalCreateFile(
        pThread,
        name,
        dwDesiredAccess,
        dwShareMode,
        lpSecurityAttributes,
        dwCreationDisposition,
        dwFlagsAndAttributes,
        hTemplateFile,
        &hRet
        );

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

done:
	pThread->SetLastError(palError);
    LOGEXIT( "CreateFileW returns HANDLE %p\n", hRet );
    PERF_EXIT(CreateFileW);
    return hRet;
}